

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool __thiscall flatbuffers::TSGRPCGenerator::generate(TSGRPCGenerator *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  bool bVar3;
  int iVar4;
  pointer *__ptr;
  int iVar5;
  undefined1 local_108 [24];
  string ts_interface_name;
  string ts_name;
  FlatBufFile file;
  string local_90;
  string local_70;
  string local_50;
  
  local_108._8_8_ = &this->code_;
  CodeWriter::Clear((CodeWriter *)local_108._8_8_);
  file.parser_ = (this->super_BaseGenerator).parser_;
  file.file_name_ = (this->super_BaseGenerator).file_name_;
  file.super_File.super_CommentHolder._vptr_CommentHolder =
       (CommentHolder)&PTR__CommentHolder_002fb398;
  file.language_ = kLanguageTS;
  local_108._16_8_ = &(this->code_).field_0x48;
  iVar2 = 0;
  while (iVar4 = iVar2,
        iVar5 = (int)((ulong)((long)((file.parser_)->services_).vec.
                                    super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((file.parser_)->services_).vec.
                                   super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3), iVar4 < iVar5)
  {
    FlatBufFile::service((FlatBufFile *)local_108,(int)&file);
    grpc_ts_generator::Generate
              (&local_50,&file.super_File,(Service *)local_108._0_8_,
               (this->super_BaseGenerator).file_name_);
    CodeWriter::operator+=((CodeWriter *)local_108._8_8_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GeneratedFileName(&ts_name,(this->super_BaseGenerator).path_,
                      (this->super_BaseGenerator).file_name_,false);
    _Var1 = ts_name._M_dataplus;
    std::__cxx11::stringbuf::str();
    bVar3 = SaveFile(_Var1._M_p,&ts_interface_name,false);
    std::__cxx11::string::~string((string *)&ts_interface_name);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&ts_name);
      if ((CommentHolder *)local_108._0_8_ != (CommentHolder *)0x0) {
        (*(*(_func_int ***)local_108._0_8_)[1])();
      }
      break;
    }
    CodeWriter::Clear((CodeWriter *)local_108._8_8_);
    grpc_ts_generator::GenerateInterface
              (&local_70,&file.super_File,(Service *)local_108._0_8_,
               (this->super_BaseGenerator).file_name_);
    CodeWriter::operator+=((CodeWriter *)local_108._8_8_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    GeneratedFileName(&ts_interface_name,(this->super_BaseGenerator).path_,
                      (this->super_BaseGenerator).file_name_,true);
    _Var1 = ts_interface_name._M_dataplus;
    std::__cxx11::stringbuf::str();
    bVar3 = SaveFile(_Var1._M_p,&local_90,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&ts_interface_name);
    std::__cxx11::string::~string((string *)&ts_name);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(*(_func_int ***)local_108._0_8_)[1])();
    }
    iVar2 = iVar4 + 1;
    if (!bVar3) break;
  }
  return iVar5 <= iVar4;
}

Assistant:

bool generate() {
    code_.Clear();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageTS);

    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_ts_generator::Generate(&file, service.get(), file_name_);
      const auto ts_name = GeneratedFileName(path_, file_name_);
      if (!SaveFile(ts_name.c_str(), code_.ToString(), false)) return false;

      code_.Clear();
      code_ += grpc_ts_generator::GenerateInterface(&file, service.get(),
                                                    file_name_);
      const auto ts_interface_name = GeneratedFileName(path_, file_name_, true);
      if (!SaveFile(ts_interface_name.c_str(), code_.ToString(), false))
        return false;
    }
    return true;
  }